

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef llvm::sys::path::root_directory(StringRef path,Style style)

{
  char cVar1;
  size_t sVar2;
  path *this;
  Style in_R8D;
  bool bVar3;
  bool bVar4;
  StringRef path_00;
  StringRef SVar5;
  const_iterator pos;
  const_iterator b;
  const_iterator local_98;
  const_iterator local_60;
  
  sVar2 = path.Length;
  this = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)sVar2;
  path_00.Length._4_4_ = 0;
  begin(&local_60,this,path_00,in_R8D);
  local_98.Position = local_60.Position;
  local_98.S = local_60.S;
  local_98._44_4_ = local_60._44_4_;
  local_98.Component.Data = local_60.Component.Data;
  local_98.Component.Length = local_60.Component.Length;
  local_98.Path.Data = local_60.Path.Data;
  local_98.Path.Length = local_60.Path.Length;
  if (((path *)local_60.Path.Data != this) || (local_60.Position != sVar2)) {
    if ((local_60.Component.Length < 3) ||
       ((cVar1 = *local_60.Component.Data, cVar1 != '/' && (cVar1 != '\\' || style != windows)))) {
      bVar3 = false;
    }
    else {
      bVar3 = local_60.Component.Data[1] == cVar1;
    }
    if (local_60.Component.Length == 0 || style != windows) {
      bVar4 = false;
    }
    else {
      bVar4 = local_60.Component.Data[local_60.Component.Length - 1] == ':';
    }
    if (((bool)(bVar4 | bVar3)) &&
       ((const_iterator::operator++(&local_98), (path *)local_98.Path.Data != this ||
        (local_98.Position != sVar2)))) {
      if (local_98.Component.Length == 0) goto LAB_001219a0;
      if ((*local_98.Component.Data == '/') ||
         (style == windows && *local_98.Component.Data == '\\')) goto LAB_0012193c;
    }
    if (!bVar3) {
      if (local_60.Component.Length == 0) {
LAB_001219a0:
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      local_98.Component.Data = local_60.Component.Data;
      local_98.Component.Length = local_60.Component.Length;
      if ((*local_60.Component.Data == '/') ||
         (style == windows && *local_60.Component.Data == '\\')) goto LAB_0012193c;
    }
  }
  local_98.Component.Length = 0;
  local_98.Component.Data = (char *)0x0;
LAB_0012193c:
  SVar5.Length = local_98.Component.Length;
  SVar5.Data = local_98.Component.Data;
  return SVar5;
}

Assistant:

StringRef root_directory(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if ((has_net || has_drive) &&
        // {C:,//net}, skip to the next component.
        (++pos != e) && is_separator((*pos)[0], style)) {
      return *pos;
    }

    // POSIX style root directory.
    if (!has_net && is_separator((*b)[0], style)) {
      return *b;
    }
  }

  // No path or no root.
  return StringRef();
}